

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  char *__format;
  char **ppcVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  fputs(*argv,(FILE *)err);
  ppcVar2 = argv;
  sVar1 = strlen(*argv);
  lVar5 = (long)((int)sVar1 + 1);
  uVar3 = 1;
  if (1 < n) {
    uVar3 = n;
  }
  lVar4 = 1;
  do {
    if (n <= lVar4) {
LAB_00109897:
      for (lVar4 = (ulong)uVar3 << 3; *(long *)((long)ppcVar2 + lVar4) != 0; lVar4 = lVar4 + 8) {
        fprintf((FILE *)err," %s");
        ppcVar2 = argv;
      }
      uVar6 = lVar5 + k;
      if (uVar6 < 0x14) {
        __format = "\n%*s^-- here\n";
      }
      else {
        uVar6 = (ulong)((int)uVar6 - 7);
        __format = "\n%*shere --^\n";
      }
      fprintf((FILE *)err,__format,uVar6 & 0xffffffff,"");
      return;
    }
    if (ppcVar2[lVar4] == (char *)0x0) {
      uVar3 = (uint)lVar4;
      goto LAB_00109897;
    }
    fprintf((FILE *)err," %s");
    ppcVar2 = argv;
    sVar1 = strlen(argv[lVar4]);
    lVar5 = lVar5 + ((long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int i;
  size_t spcnt;
  if( argv[0] ) fprintf(err,"%s",argv[0]);
  spcnt = lemonStrlen(argv[0]) + 1;
  for(i=1; i<n && argv[i]; i++){
    fprintf(err," %s",argv[i]);
    spcnt += lemonStrlen(argv[i])+1;
  }
  spcnt += k;
  for(; argv[i]; i++) fprintf(err," %s",argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",(int)spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",(int)spcnt-7,"");
  }
}